

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_check_EOF(BGZF *fp)

{
  int iVar1;
  off_t oVar2;
  off_t oVar3;
  int *piVar4;
  ssize_t sVar5;
  off_t offset;
  uint8_t buf [28];
  BGZF *fp_local;
  
  unique0x100000f1 = fp;
  oVar2 = htell(fp->fp);
  oVar3 = hseek(stack0xffffffffffffffe8->fp,-0x1c,2);
  if (oVar3 < 0) {
    piVar4 = __errno_location();
    if (*piVar4 == 0x1d) {
      hclearerr(stack0xffffffffffffffe8->fp);
      fp_local._4_4_ = 2;
    }
    else {
      fp_local._4_4_ = 0xffffffff;
    }
  }
  else {
    sVar5 = hread(stack0xffffffffffffffe8->fp,&offset,0x1c);
    if (sVar5 == 0x1c) {
      oVar2 = hseek(stack0xffffffffffffffe8->fp,oVar2,0);
      if (oVar2 < 0) {
        fp_local._4_4_ = 0xffffffff;
      }
      else {
        iVar1 = memcmp(anon_var_dwarf_23c2a,&offset,0x1c);
        fp_local._4_4_ = (uint)(iVar1 == 0);
      }
    }
    else {
      fp_local._4_4_ = 0xffffffff;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_check_EOF(BGZF *fp)
{
    uint8_t buf[28];
    off_t offset = htell(fp->fp);
    if (hseek(fp->fp, -28, SEEK_END) < 0) {
        if (errno == ESPIPE) { hclearerr(fp->fp); return 2; }
        else return -1;
    }
    if ( hread(fp->fp, buf, 28) != 28 ) return -1;
    if ( hseek(fp->fp, offset, SEEK_SET) < 0 ) return -1;
    return (memcmp("\037\213\010\4\0\0\0\0\0\377\6\0\102\103\2\0\033\0\3\0\0\0\0\0\0\0\0\0", buf, 28) == 0)? 1 : 0;
}